

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::WriteBlock(BamToolsIndex *this,BtiBlock *block)

{
  long lVar1;
  undefined8 uVar2;
  int32_t *in_RSI;
  long in_RDI;
  int expectedBytes;
  int64_t numBytesWritten;
  int32_t startPosition;
  int64_t startOffset;
  int32_t maxEndPosition;
  allocator local_91;
  string local_90 [16];
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  BamException *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [36];
  undefined4 local_34;
  long local_30;
  int32_t local_24;
  int64_t local_20;
  int32_t local_14 [5];
  
  local_14[0] = *in_RSI;
  local_20 = *(int64_t *)(in_RSI + 2);
  local_24 = in_RSI[4];
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(local_14);
    SwapEndian_64(&local_20);
    SwapEndian_32(&local_24);
  }
  local_30 = 0;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),local_14,4);
  local_30 = lVar1 + local_30;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),&local_20,8);
  local_30 = lVar1 + local_30;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),&local_24,4);
  local_30 = lVar1 + local_30;
  local_34 = 0x10;
  if (local_30 != 0x10) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"BamToolsIndex::WriteBlock",&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"could not write BTI block",&local_91);
    BamException::BamException
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamToolsIndex::WriteBlock(const BtiBlock& block)
{

    // copy entry data
    int32_t maxEndPosition = block.MaxEndPosition;
    int64_t startOffset = block.StartOffset;
    int32_t startPosition = block.StartPosition;

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_32(maxEndPosition);
        SwapEndian_64(startOffset);
        SwapEndian_32(startPosition);
    }

    // write the reference index entry
    int64_t numBytesWritten = 0;
    numBytesWritten +=
        m_resources.Device->Write((const char*)&maxEndPosition, sizeof(maxEndPosition));
    numBytesWritten += m_resources.Device->Write((const char*)&startOffset, sizeof(startOffset));
    numBytesWritten +=
        m_resources.Device->Write((const char*)&startPosition, sizeof(startPosition));

    // check block written ok
    const int expectedBytes = sizeof(maxEndPosition) + sizeof(startOffset) + sizeof(startPosition);
    if (numBytesWritten != expectedBytes)
        throw BamException("BamToolsIndex::WriteBlock", "could not write BTI block");
}